

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O2

void print_helper2(size_t *i)

{
  size_t sVar1;
  
  sVar1 = *i;
  if (sVar1 == 0) {
    std::operator<<((ostream *)&std::cout,"|  Cost  ");
    sVar1 = *i;
  }
  if (sVar1 == 1) {
    std::operator<<((ostream *)&std::cout,"|  Exp   ");
    sVar1 = *i;
  }
  if (sVar1 == 2) {
    std::operator<<((ostream *)&std::cout,"|  Gas   ");
    sVar1 = *i;
  }
  if (sVar1 == 3) {
    std::operator<<((ostream *)&std::cout,"|  Comf  ");
    return;
  }
  return;
}

Assistant:

void print_helper2(size_t &i) {
    if (i == 0)
        std::cout << "|  Cost  ";
    if (i == 1)
        std::cout << "|  Exp   ";
    if (i == 2)
        std::cout << "|  Gas   ";
    if (i == 3)
        std::cout << "|  Comf  ";

}